

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O0

hash_type __thiscall game_hasher::operator()(game_hasher *this,game_t *game)

{
  bool bVar1;
  reference puVar2;
  size_t sVar3;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_1b0;
  hash<int> local_1a1;
  unsigned_long local_1a0;
  unsigned_long c;
  iterator __end2;
  iterator __begin2;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  deque<unsigned_long,_std::allocator<unsigned_long>_> g;
  const_iterator __end1;
  const_iterator __begin1;
  deque<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  deque<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  size_type local_30;
  initializer_list<std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *local_28;
  initializer_list<std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *__range1;
  size_t h;
  game_t *game_local;
  game_hasher *this_local;
  
  __range1 = (initializer_list<std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x0;
  h = (size_t)game;
  game_local = (game_t *)this;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&local_d8,&game->first);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
            (&local_88,(deque<unsigned_long,_std::allocator<unsigned_long>_> *)(h + 0x50));
  local_38 = &local_d8;
  local_30 = 2;
  local_28 = (initializer_list<std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &stack0xffffffffffffffc8;
  __end1 = std::initializer_list<std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::begin
                     (local_28);
  g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node =
       (_Map_pointer)
       std::initializer_list<std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::end
                 (local_28);
  for (; __end1 != (const_iterator)
                   g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node; __end1 = __end1 + 1) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2,__end1);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((iterator *)&__end2._M_node,
               (deque<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((iterator *)&c,(deque<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
    while( true ) {
      bVar1 = std::operator==((_Self *)&__end2._M_node,(_Self *)&c);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      puVar2 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator*
                         ((_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*> *)
                          &__end2._M_node);
      local_1a0 = *puVar2;
      sVar3 = std::hash<int>::operator()(&local_1a1,(int)local_1a0);
      __range1 = (initializer_list<std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                 (sVar3 + 0x9e3779b9 + (long)__range1 * 0x40 + ((ulong)__range1 >> 2) ^
                 (ulong)__range1);
      std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator++
                ((_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*> *)&__end2._M_node
                );
    }
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
  }
  local_1b0 = (deque<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffc8;
  do {
    local_1b0 = local_1b0 + -1;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque(local_1b0);
  } while (local_1b0 != &local_d8);
  return (hash_type)__range1;
}

Assistant:

hash_type operator()(const game_t & game) const {
    std::size_t h = 0;
    for (auto g : {game.first, game.second})
      for (auto c : g)
        h ^= std::hash<int>{}(c)  + 0x9e3779b9 + (h << 6u) + (h >> 2u);
    return h;
  }